

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# eclmap.c
# Opt level: O3

void eclmap_free(eclmap_t *map)

{
  if (map != (eclmap_t *)0x0) {
    seqmap_free(map->ins_names);
    seqmap_free(map->ins_signatures);
    seqmap_free(map->gvar_names);
    seqmap_free(map->gvar_types);
    seqmap_free(map->timeline_ins_names);
    seqmap_free(map->timeline_ins_signatures);
    free(map->mnem_set);
    free(map);
    return;
  }
  return;
}

Assistant:

void
eclmap_free(
    eclmap_t *map)
{
    if (map) {
        seqmap_free(map->ins_names);
        seqmap_free(map->ins_signatures);
        seqmap_free(map->gvar_names);
        seqmap_free(map->gvar_types);
        seqmap_free(map->timeline_ins_names);
        seqmap_free(map->timeline_ins_signatures);
        free(map->mnem_set);
        free(map);
    }
}